

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O1

bool GetCScript(SigningProvider *provider,SignatureData *sigdata,CScriptID *scriptid,CScript *script
               )

{
  undefined4 uVar1;
  int iVar2;
  bool bVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  CScriptID local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*provider->_vptr_SigningProvider[2])(provider,scriptid,script);
  bVar3 = true;
  if ((char)iVar2 == '\0') {
    other = &(sigdata->redeem_script).super_CScriptBase;
    CScriptID::CScriptID(&local_4c,(CScript *)other);
    auVar4[0] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [0] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                         _M_elems[0]);
    auVar4[1] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [1] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                         _M_elems[1]);
    auVar4[2] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [2] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                         _M_elems[2]);
    auVar4[3] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [3] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                         _M_elems[3]);
    auVar4[4] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [4] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                         _M_elems[4]);
    auVar4[5] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [5] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                         _M_elems[5]);
    auVar4[6] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [6] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                         _M_elems[6]);
    auVar4[7] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [7] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                         _M_elems[7]);
    auVar4[8] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [8] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                         _M_elems[8]);
    auVar4[9] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [9] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                         _M_elems[9]);
    auVar4[10] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [10] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                           _M_elems[10]);
    auVar4[0xb] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [0xb] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                             _M_elems[0xb]);
    auVar4[0xc] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [0xc] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                             _M_elems[0xc]);
    auVar4[0xd] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [0xd] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                             _M_elems[0xd]);
    auVar4[0xe] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [0xe] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                             _M_elems[0xe]);
    auVar4[0xf] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [0xf] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                             _M_elems[0xf]);
    uVar1 = *(undefined4 *)
             ((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems +
             0x10);
    auVar6[0] = -((uchar)uVar1 ==
                 local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10]
                 );
    auVar6[1] = -((uchar)((uint)uVar1 >> 8) ==
                 local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11]
                 );
    auVar6[2] = -((uchar)((uint)uVar1 >> 0x10) ==
                 local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12]
                 );
    auVar6[3] = -((uchar)((uint)uVar1 >> 0x18) ==
                 local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13]
                 );
    auVar6[4] = 0xff;
    auVar6[5] = 0xff;
    auVar6[6] = 0xff;
    auVar6[7] = 0xff;
    auVar6[8] = 0xff;
    auVar6[9] = 0xff;
    auVar6[10] = 0xff;
    auVar6[0xb] = 0xff;
    auVar6[0xc] = 0xff;
    auVar6[0xd] = 0xff;
    auVar6[0xe] = 0xff;
    auVar6[0xf] = 0xff;
    auVar6 = auVar6 & auVar4;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) {
      other = &(sigdata->witness_script).super_CScriptBase;
      CScriptID::CScriptID(&local_4c,(CScript *)other);
      auVar5[0] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [0] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                           _M_elems[0]);
      auVar5[1] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [1] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                           _M_elems[1]);
      auVar5[2] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [2] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                           _M_elems[2]);
      auVar5[3] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [3] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                           _M_elems[3]);
      auVar5[4] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [4] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                           _M_elems[4]);
      auVar5[5] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [5] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                           _M_elems[5]);
      auVar5[6] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [6] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                           _M_elems[6]);
      auVar5[7] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [7] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                           _M_elems[7]);
      auVar5[8] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [8] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                           _M_elems[8]);
      auVar5[9] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                    [9] == local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                           _M_elems[9]);
      auVar5[10] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data.
                     _M_elems[10] ==
                    local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                    [10]);
      auVar5[0xb] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data.
                      _M_elems[0xb] ==
                     local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                     [0xb]);
      auVar5[0xc] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data.
                      _M_elems[0xc] ==
                     local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                     [0xc]);
      auVar5[0xd] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data.
                      _M_elems[0xd] ==
                     local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                     [0xd]);
      auVar5[0xe] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data.
                      _M_elems[0xe] ==
                     local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                     [0xe]);
      auVar5[0xf] = -((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data.
                      _M_elems[0xf] ==
                     local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                     [0xf]);
      uVar1 = *(undefined4 *)
               ((scriptid->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems +
               0x10);
      auVar7[0] = -((uchar)uVar1 ==
                   local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                   [0x10]);
      auVar7[1] = -((uchar)((uint)uVar1 >> 8) ==
                   local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                   [0x11]);
      auVar7[2] = -((uchar)((uint)uVar1 >> 0x10) ==
                   local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                   [0x12]);
      auVar7[3] = -((uchar)((uint)uVar1 >> 0x18) ==
                   local_4c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                   [0x13]);
      auVar7[4] = 0xff;
      auVar7[5] = 0xff;
      auVar7[6] = 0xff;
      auVar7[7] = 0xff;
      auVar7[8] = 0xff;
      auVar7[9] = 0xff;
      auVar7[10] = 0xff;
      auVar7[0xb] = 0xff;
      auVar7[0xc] = 0xff;
      auVar7[0xd] = 0xff;
      auVar7[0xe] = 0xff;
      auVar7[0xf] = 0xff;
      auVar7 = auVar7 & auVar5;
      if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) != 0xffff) {
        bVar3 = false;
        goto LAB_00194960;
      }
    }
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=(&script->super_CScriptBase,other);
  }
LAB_00194960:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool GetCScript(const SigningProvider& provider, const SignatureData& sigdata, const CScriptID& scriptid, CScript& script)
{
    if (provider.GetCScript(scriptid, script)) {
        return true;
    }
    // Look for scripts in SignatureData
    if (CScriptID(sigdata.redeem_script) == scriptid) {
        script = sigdata.redeem_script;
        return true;
    } else if (CScriptID(sigdata.witness_script) == scriptid) {
        script = sigdata.witness_script;
        return true;
    }
    return false;
}